

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

FilePath __thiscall testing::internal::FilePath::RemoveFileName(FilePath *this)

{
  char *buffer;
  long lVar1;
  char *pcVar2;
  size_t extraout_RDX;
  FilePath *in_RSI;
  FilePath FVar3;
  String local_40;
  undefined1 local_30 [8];
  String dir;
  char *last_sep;
  FilePath *this_local;
  
  dir.length_ = (size_t)FindLastPathSeparator(in_RSI);
  String::String((String *)local_30);
  if (dir.length_ == 0) {
    String::operator=((String *)local_30,"./");
  }
  else {
    buffer = c_str(in_RSI);
    lVar1 = dir.length_ + 1;
    pcVar2 = c_str(in_RSI);
    String::String(&local_40,buffer,lVar1 - (long)pcVar2);
    String::operator=((String *)local_30,&local_40);
    String::~String(&local_40);
  }
  FilePath(this,(String *)local_30);
  String::~String((String *)local_30);
  FVar3.pathname_.length_ = extraout_RDX;
  FVar3.pathname_.c_str_ = (char *)this;
  return (FilePath)FVar3.pathname_;
}

Assistant:

FilePath FilePath::RemoveFileName() const {
  const char* const last_sep = FindLastPathSeparator();
  String dir;
  if (last_sep) {
    dir = String(c_str(), last_sep + 1 - c_str());
  } else {
    dir = kCurrentDirectoryString;
  }
  return FilePath(dir);
}